

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O0

void __thiscall
pzgeom::TPZNodeRep<4,_pztopology::TPZQuadrilateral>::Print
          (TPZNodeRep<4,_pztopology::TPZQuadrilateral> *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  int nn;
  int local_14;
  
  std::operator<<(in_RSI,"Nodeindices: ");
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(in_RSI,*(long *)(in_RDI + 8 + (long)local_14 * 8));
    std::operator<<(poVar1,' ');
  }
  std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Print(std::ostream &out) const
        {
            int nn;
            out << "Nodeindices: ";
            for(nn=0; nn<N; nn++)
            {
                out << fNodeIndexes[nn] << ' ';
            }
            out << std::endl;
        }